

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_3::traverseVariablePath
               (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *typePath,char *subPath,VarType *type)

{
  bool bVar1;
  Token TVar2;
  int iVar3;
  int iVar4;
  StructType *pSVar5;
  StructMember *pSVar6;
  char *__lhs;
  VarType *pVVar7;
  string local_88;
  int local_64;
  undefined4 local_60;
  int memberNdx;
  VariablePathComponent local_50;
  undefined1 local_40 [8];
  VarTokenizer tokenizer;
  VarType *type_local;
  char *subPath_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *typePath_local;
  
  tokenizer._16_8_ = type;
  glu::VarTokenizer::VarTokenizer((VarTokenizer *)local_40,subPath);
  ProgramInterfaceDefinition::VariablePathComponent::VariablePathComponent
            (&local_50,(VarType *)tokenizer._16_8_);
  std::
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  ::push_back(typePath,&local_50);
  TVar2 = glu::VarTokenizer::getToken((VarTokenizer *)local_40);
  if (TVar2 == TOKEN_END) {
    typePath_local._7_1_ = true;
  }
  else {
    bVar1 = glu::VarType::isStructType((VarType *)tokenizer._16_8_);
    if ((bVar1) &&
       (TVar2 = glu::VarTokenizer::getToken((VarTokenizer *)local_40), TVar2 == TOKEN_PERIOD)) {
      glu::VarTokenizer::advance((VarTokenizer *)local_40);
      TVar2 = glu::VarTokenizer::getToken((VarTokenizer *)local_40);
      if (TVar2 == TOKEN_IDENTIFIER) {
        local_64 = 0;
        while( true ) {
          iVar4 = local_64;
          pSVar5 = glu::VarType::getStructPtr((VarType *)tokenizer._16_8_);
          iVar3 = glu::StructType::getNumMembers(pSVar5);
          if (iVar3 <= iVar4) break;
          pSVar5 = glu::VarType::getStructPtr((VarType *)tokenizer._16_8_);
          pSVar6 = glu::StructType::getMember(pSVar5,local_64);
          __lhs = glu::StructMember::getName(pSVar6);
          glu::VarTokenizer::getIdentifier_abi_cxx11_(&local_88,(VarTokenizer *)local_40);
          bVar1 = std::operator==(__lhs,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          if (bVar1) {
            iVar4 = glu::VarTokenizer::getCurrentTokenEndLocation((VarTokenizer *)local_40);
            pSVar5 = glu::VarType::getStructPtr((VarType *)tokenizer._16_8_);
            pSVar6 = glu::StructType::getMember(pSVar5,local_64);
            pVVar7 = glu::StructMember::getType(pSVar6);
            typePath_local._7_1_ = traverseVariablePath(typePath,subPath + iVar4,pVVar7);
            goto LAB_00a622ee;
          }
          local_64 = local_64 + 1;
        }
        typePath_local._7_1_ = false;
      }
      else {
        typePath_local._7_1_ = false;
      }
    }
    else {
      bVar1 = glu::VarType::isArrayType((VarType *)tokenizer._16_8_);
      if ((bVar1) &&
         (TVar2 = glu::VarTokenizer::getToken((VarTokenizer *)local_40), TVar2 == TOKEN_LEFT_BRACKET
         )) {
        glu::VarTokenizer::advance((VarTokenizer *)local_40);
        TVar2 = glu::VarTokenizer::getToken((VarTokenizer *)local_40);
        if (TVar2 == TOKEN_NUMBER) {
          glu::VarTokenizer::advance((VarTokenizer *)local_40);
          TVar2 = glu::VarTokenizer::getToken((VarTokenizer *)local_40);
          if (TVar2 == TOKEN_RIGHT_BRACKET) {
            iVar4 = glu::VarTokenizer::getCurrentTokenEndLocation((VarTokenizer *)local_40);
            pVVar7 = glu::VarType::getElementType((VarType *)tokenizer._16_8_);
            typePath_local._7_1_ = traverseVariablePath(typePath,subPath + iVar4,pVVar7);
          }
          else {
            typePath_local._7_1_ = false;
          }
        }
        else {
          typePath_local._7_1_ = false;
        }
      }
      else {
        typePath_local._7_1_ = false;
      }
    }
  }
LAB_00a622ee:
  local_60 = 1;
  glu::VarTokenizer::~VarTokenizer((VarTokenizer *)local_40);
  return typePath_local._7_1_;
}

Assistant:

static bool traverseVariablePath (std::vector<VariablePathComponent>& typePath, const char* subPath, const glu::VarType& type)
{
	glu::VarTokenizer tokenizer(subPath);

	typePath.push_back(VariablePathComponent(&type));

	if (tokenizer.getToken() == glu::VarTokenizer::TOKEN_END)
		return true;

	if (type.isStructType() && tokenizer.getToken() == glu::VarTokenizer::TOKEN_PERIOD)
	{
		tokenizer.advance();

		// malformed path
		if (tokenizer.getToken() != glu::VarTokenizer::TOKEN_IDENTIFIER)
			return false;

		for (int memberNdx = 0; memberNdx < type.getStructPtr()->getNumMembers(); ++memberNdx)
			if (type.getStructPtr()->getMember(memberNdx).getName() == tokenizer.getIdentifier())
				return traverseVariablePath(typePath, subPath + tokenizer.getCurrentTokenEndLocation(), type.getStructPtr()->getMember(memberNdx).getType());

		// malformed path, no such member
		return false;
	}
	else if (type.isArrayType() && tokenizer.getToken() == glu::VarTokenizer::TOKEN_LEFT_BRACKET)
	{
		tokenizer.advance();

		// malformed path
		if (tokenizer.getToken() != glu::VarTokenizer::TOKEN_NUMBER)
			return false;

		tokenizer.advance();
		if (tokenizer.getToken() != glu::VarTokenizer::TOKEN_RIGHT_BRACKET)
			return false;

		return traverseVariablePath(typePath, subPath + tokenizer.getCurrentTokenEndLocation(), type.getElementType());
	}

	return false;
}